

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

BSDF * __thiscall
pbrt::CoatedConductorMaterial::GetBSDF<pbrt::UniversalTextureEvaluator>
          (BSDF *__return_storage_ptr__,CoatedConductorMaterial *this,TextureEvalContext *param_3,
          SampledWavelengths *param_4,undefined8 *param_5)

{
  uint8_t uVar1;
  undefined2 uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 extraout_var;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar14 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar22 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined8 uVar26;
  undefined1 auVar25 [56];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar27 [16];
  SampledSpectrum SVar28;
  UniversalTextureEvaluator local_425;
  Float local_424;
  float local_420;
  uint local_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  Float local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  Float local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  BxDFHandle local_380;
  uintptr_t local_378;
  uintptr_t local_370;
  uintptr_t local_368;
  uintptr_t local_360;
  uintptr_t local_358;
  uintptr_t local_350;
  uintptr_t local_348;
  uintptr_t local_340;
  uintptr_t local_338;
  uintptr_t local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  SampledSpectrum local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 uStack_280;
  undefined8 local_278;
  ulong uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  local_330 = (this->interfaceURoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_78._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_78._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_70 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_68._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_68._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_60._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_60._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_58 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_50 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_48._0_4_ = param_3->dudy;
  uStack_48._4_4_ = param_3->dvdx;
  uStack_40._0_4_ = param_3->dvdy;
  uStack_40._4_4_ = param_3->faceIndex;
  local_418._0_4_ =
       UniversalTextureEvaluator::operator()(&local_425,(FloatTextureHandle)&local_330,*param_3);
  local_338 = (this->interfaceVRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_b0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_98 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_90 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_88._0_4_ = param_3->dudy;
  uStack_88._4_4_ = param_3->dvdx;
  uStack_80._0_4_ = param_3->dvdy;
  uStack_80._4_4_ = param_3->faceIndex;
  auVar14._0_4_ =
       UniversalTextureEvaluator::operator()(&local_425,(FloatTextureHandle)&local_338,*param_3);
  auVar14._4_60_ = extraout_var_00;
  auVar11 = auVar14._0_16_;
  if (this->remapRoughness == true) {
    if ((float)local_418._0_4_ < 0.0) {
      local_424 = auVar14._0_4_;
      fVar10 = sqrtf((float)local_418._0_4_);
      auVar11 = ZEXT416((uint)local_424);
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)local_418._0_4_),ZEXT416((uint)local_418._0_4_));
      fVar10 = auVar12._0_4_;
    }
    local_418._0_4_ = fVar10;
    if (auVar11._0_4_ < 0.0) {
      local_424 = sqrtf(auVar11._0_4_);
      goto LAB_00396124;
    }
    auVar11 = vsqrtss_avx(auVar11,auVar11);
  }
  local_424 = auVar11._0_4_;
LAB_00396124:
  local_340 = (this->thickness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_f8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_f8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_f0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_e8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_e8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_e0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_e0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_d8 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_d0 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_c8._0_4_ = param_3->dudy;
  uStack_c8._4_4_ = param_3->dvdx;
  uStack_c0._0_4_ = param_3->dvdy;
  uStack_c0._4_4_ = param_3->faceIndex;
  local_398 = UniversalTextureEvaluator::operator()
                        (&local_425,(FloatTextureHandle)&local_340,*param_3);
  local_348 = (this->interfaceEta).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_138._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_138._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_130 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_128._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_128._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_120._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_120._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_118 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_110 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_108._0_4_ = param_3->dudy;
  uStack_108._4_4_ = param_3->dvdx;
  uStack_100._0_4_ = param_3->dvdy;
  uStack_100._4_4_ = param_3->faceIndex;
  uVar26 = 0;
  uStack_394 = extraout_XMM0_Db;
  uStack_390 = extraout_XMM0_Dc;
  uStack_38c = extraout_XMM0_Dd;
  local_3a8 = UniversalTextureEvaluator::operator()
                        (&local_425,(FloatTextureHandle)&local_348,*param_3);
  local_350 = (this->conductorEta).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_178._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_178._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uVar20 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_168._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_168._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_160._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_160._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_158 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_150 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_148._0_4_ = param_3->dudy;
  uStack_148._4_4_ = param_3->dvdx;
  uStack_140._0_4_ = param_3->dvdy;
  uStack_140._4_4_ = param_3->faceIndex;
  local_2e8 = *(undefined8 *)(param_4->lambda).values;
  uStack_2e0 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_2d8 = *(undefined8 *)(param_4->pdf).values;
  uStack_2d0 = *(undefined8 *)((param_4->pdf).values + 2);
  uStack_3a4 = extraout_XMM0_Db_00;
  uStack_3a0 = extraout_XMM0_Dc_00;
  uStack_39c = extraout_XMM0_Dd_00;
  uStack_170 = uVar20;
  SVar28 = UniversalTextureEvaluator::operator()
                     (&local_425,(SpectrumTextureHandle)&local_350,*param_3,*param_4);
  local_3c8 = SVar28.values.values._8_8_;
  local_3b8 = SVar28.values.values._0_8_;
  local_358 = (this->k).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  local_1b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uVar21 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_198 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_190 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_188._0_4_ = param_3->dudy;
  uStack_188._4_4_ = param_3->dvdx;
  uStack_180._0_4_ = param_3->dvdy;
  uStack_180._4_4_ = param_3->faceIndex;
  local_308 = *(undefined8 *)(param_4->lambda).values;
  uStack_300 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_2f8 = *(undefined8 *)(param_4->pdf).values;
  uStack_2f0 = *(undefined8 *)((param_4->pdf).values + 2);
  uStack_3c0 = uVar26;
  uStack_3b0 = uVar20;
  uStack_1b0 = uVar21;
  SVar28 = UniversalTextureEvaluator::operator()
                     (&local_425,(SpectrumTextureHandle)&local_358,*param_3,*param_4);
  local_3e8 = SVar28.values.values._8_8_;
  local_3d8 = SVar28.values.values._0_8_;
  local_360 = (this->conductorURoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_1f8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_1f8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_1f0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_1e8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1e8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1e0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_1e0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_1d8 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_1d0 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_1c8._0_4_ = param_3->dudy;
  uStack_1c8._4_4_ = param_3->dvdx;
  uStack_1c0._0_4_ = param_3->dvdy;
  uStack_1c0._4_4_ = param_3->faceIndex;
  uStack_3e0 = uVar26;
  uStack_3d0 = uVar21;
  local_420 = UniversalTextureEvaluator::operator()
                        (&local_425,(FloatTextureHandle)&local_360,*param_3);
  local_368 = (this->conductorVRoughness).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_238._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_238._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_230 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_228._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_228._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_220._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_220._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_218 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_210 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_208._0_4_ = param_3->dudy;
  uStack_208._4_4_ = param_3->dvdx;
  uStack_200._0_4_ = param_3->dvdy;
  uStack_200._4_4_ = param_3->faceIndex;
  auVar15._0_4_ =
       UniversalTextureEvaluator::operator()(&local_425,(FloatTextureHandle)&local_368,*param_3);
  fVar10 = local_420;
  auVar15._4_60_ = extraout_var_01;
  auVar11 = auVar15._0_16_;
  if (this->remapRoughness == true) {
    if (local_420 < 0.0) {
      local_420 = auVar15._0_4_;
      auVar16._0_4_ = sqrtf(fVar10);
      auVar16._4_60_ = extraout_var_02;
      auVar11 = ZEXT416((uint)local_420);
      auVar12 = auVar16._0_16_;
    }
    else {
      auVar12 = vsqrtss_avx(ZEXT416((uint)local_420),ZEXT416((uint)local_420));
    }
    if (auVar11._0_4_ < 0.0) {
      local_420 = auVar12._0_4_;
      auVar17._0_4_ = sqrtf(auVar11._0_4_);
      auVar17._4_60_ = extraout_var_03;
      auVar12 = ZEXT416((uint)local_420);
      auVar11 = auVar17._0_16_;
    }
    else {
      auVar11 = vsqrtss_avx(auVar11,auVar11);
    }
  }
  else {
    auVar12 = ZEXT416((uint)local_420);
  }
  local_370 = (this->albedo).
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits;
  auVar13 = SUB6416(ZEXT464(0x38d1b717),0);
  auVar3 = vmaxss_avx(ZEXT416((uint)local_424),auVar13);
  local_424 = auVar3._0_4_;
  local_418 = vmaxss_avx(ZEXT416((uint)local_418._0_4_),auVar13);
  auVar12 = vmaxss_avx(auVar12,auVar13);
  auVar11 = vmaxss_avx(auVar11,auVar13);
  local_41c = auVar11._0_4_;
  local_278._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_278._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_270 = *(ulong *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_268._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_268._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_260._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_260._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_258 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_250 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_248._0_4_ = param_3->dudy;
  uStack_248._4_4_ = param_3->dvdx;
  uStack_240._0_4_ = param_3->dvdy;
  uStack_240._4_4_ = param_3->faceIndex;
  local_420 = auVar12._0_4_;
  local_328 = *(undefined8 *)(param_4->lambda).values;
  uStack_320 = *(undefined8 *)((param_4->lambda).values + 2);
  uStack_318 = *(undefined8 *)(param_4->pdf).values;
  uStack_310 = *(undefined8 *)((param_4->pdf).values + 2);
  auVar22 = ZEXT856(uStack_270);
  auVar25 = ZEXT856(auVar12._8_8_);
  SVar28 = UniversalTextureEvaluator::operator()
                     (&local_425,(SpectrumTextureHandle)&local_370,*param_3,*param_4);
  auVar23._0_8_ = SVar28.values.values._8_8_;
  auVar23._8_56_ = auVar25;
  auVar18._0_8_ = SVar28.values.values._0_8_;
  auVar18._8_56_ = auVar22;
  local_2c8.values.values = (array<float,_4>)vmovlhps_avx(auVar18._0_16_,auVar23._0_16_);
  uVar20 = local_2c8.values.values._8_8_;
  SVar28 = Clamp<int,int>(&local_2c8,0,1);
  auVar24._0_8_ = SVar28.values.values._8_8_;
  auVar24._8_56_ = auVar25;
  local_3f8 = SVar28.values.values._0_8_;
  local_378 = (this->g).
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits;
  local_408 = auVar24._0_16_;
  local_2b8._0_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.x;
  local_2b8._4_4_ = (param_3->p).super_Tuple3<pbrt::Point3,_float>.y;
  uStack_2b0 = *(undefined8 *)&(param_3->p).super_Tuple3<pbrt::Point3,_float>.z;
  uStack_2a8._0_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_2a8._4_4_ = (param_3->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_2a0._0_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  uStack_2a0._4_4_ = (param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_298 = *(undefined8 *)&(param_3->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_290 = *(undefined8 *)&(param_3->uv).super_Tuple2<pbrt::Point2,_float>.y;
  uStack_288._0_4_ = param_3->dudy;
  uStack_288._4_4_ = param_3->dvdx;
  uStack_280._0_4_ = param_3->dvdy;
  uStack_280._4_4_ = param_3->faceIndex;
  uStack_3f0 = uVar20;
  auVar19._0_4_ =
       UniversalTextureEvaluator::operator()(&local_425,(FloatTextureHandle)&local_378,*param_3);
  auVar19._4_60_ = extraout_var_04;
  auVar7._4_4_ = uStack_3a4;
  auVar7._0_4_ = local_3a8;
  auVar7._8_4_ = uStack_3a0;
  auVar7._12_4_ = uStack_39c;
  uVar2 = *(undefined2 *)&this->config;
  uVar1 = (this->config).twoSided;
  auVar27._8_8_ = 0xbf80000000800000;
  auVar27._0_8_ = 0xbf80000000800000;
  uVar20 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0x3f800000),0),0);
  bVar5 = (bool)((byte)uVar20 & 1);
  auVar12 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar19._0_16_);
  auVar11 = vinsertps_avx(ZEXT416((uint)bVar5 * 0x3f8020c5 + (uint)!bVar5 * (int)local_3a8),
                          ZEXT416((uint)local_418._0_4_),0x10);
  auVar8._4_4_ = uStack_394;
  auVar8._0_4_ = local_398;
  auVar8._8_4_ = uStack_390;
  auVar8._12_4_ = uStack_38c;
  uVar20 = vmovlps_avx(auVar11);
  *param_5 = uVar20;
  auVar11 = vinsertps_avx(auVar8,auVar19._0_16_,0x10);
  uVar4 = vcmpps_avx512vl(auVar11,auVar27,1);
  auVar11 = vinsertps_avx(auVar8,auVar12,0x10);
  *(Float *)(param_5 + 1) = local_424;
  auVar6._8_8_ = uStack_3b0;
  auVar6._0_8_ = local_3b8;
  *(ulong *)((long)param_5 + 0xc) = CONCAT44(extraout_var,local_420) | (ulong)local_41c << 0x20;
  bVar5 = (bool)((byte)uVar4 & 1);
  auVar9._0_4_ = (uint)bVar5 * 0x800000 | (uint)!bVar5 * auVar11._0_4_;
  bVar5 = (bool)((byte)(uVar4 >> 1) & 1);
  auVar9._4_4_ = (uint)bVar5 * -0x40800000 | (uint)!bVar5 * auVar11._4_4_;
  bVar5 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar9._8_4_ = (uint)bVar5 * 0x800000 | (uint)!bVar5 * auVar11._8_4_;
  bVar5 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar9._12_4_ = (uint)bVar5 * -0x40800000 | (uint)!bVar5 * auVar11._12_4_;
  auVar13._8_8_ = uStack_3c0;
  auVar13._0_8_ = local_3c8;
  auVar11 = vunpcklpd_avx(auVar6,auVar13);
  *(undefined1 (*) [16])((long)param_5 + 0x14) = auVar11;
  auVar3._8_8_ = uStack_3d0;
  auVar3._0_8_ = local_3d8;
  auVar12._8_8_ = uStack_3e0;
  auVar12._0_8_ = local_3e8;
  auVar11 = vunpcklpd_avx(auVar3,auVar12);
  *(undefined1 (*) [16])((long)param_5 + 0x24) = auVar11;
  uVar20 = vmovlps_avx(auVar9);
  *(undefined8 *)((long)param_5 + 0x34) = uVar20;
  auVar11._8_8_ = uStack_3f0;
  auVar11._0_8_ = local_3f8;
  auVar11 = vunpcklpd_avx(auVar11,local_408);
  *(undefined1 (*) [16])((long)param_5 + 0x3c) = auVar11;
  *(uint8_t *)((long)param_5 + 0x4e) = uVar1;
  *(undefined2 *)((long)param_5 + 0x4c) = uVar2;
  local_380.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )((ulong)param_5 | 0x4000000000000);
  BSDF::BSDF(__return_storage_ptr__,(Vector3f *)(param_3 + 1),(Normal3f *)&param_3[1].dpdx,
             (Normal3f *)&param_3[1].dpdy,(Vector3f *)&param_3[1].uv,&local_380,1.0);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU BSDF GetBSDF(TextureEvaluator texEval, const MaterialEvalContext &ctx,
                              SampledWavelengths &lambda,
                              CoatedConductorBxDF *bxdf) const {
        Float iurough = texEval(interfaceURoughness, ctx);
        Float ivrough = texEval(interfaceVRoughness, ctx);
        if (remapRoughness) {
            iurough = TrowbridgeReitzDistribution::RoughnessToAlpha(iurough);
            ivrough = TrowbridgeReitzDistribution::RoughnessToAlpha(ivrough);
        }
        TrowbridgeReitzDistribution interfaceDistrib(iurough, ivrough);

        Float thick = texEval(thickness, ctx);
        Float ieta = texEval(interfaceEta, ctx);

        SampledSpectrum ce = texEval(conductorEta, ctx, lambda);
        SampledSpectrum ck = texEval(k, ctx, lambda);
        Float curough = texEval(conductorURoughness, ctx);
        Float cvrough = texEval(conductorVRoughness, ctx);
        if (remapRoughness) {
            curough = TrowbridgeReitzDistribution::RoughnessToAlpha(curough);
            cvrough = TrowbridgeReitzDistribution::RoughnessToAlpha(cvrough);
        }
        TrowbridgeReitzDistribution conductorDistrib(curough, cvrough);

        SampledSpectrum a = Clamp(texEval(albedo, ctx, lambda), 0, 1);
        Float gg = Clamp(texEval(g, ctx), -1, 1);

        *bxdf = CoatedConductorBxDF(DielectricInterfaceBxDF(ieta, interfaceDistrib),
                                    ConductorBxDF(conductorDistrib, ce, ck), thick, a, gg,
                                    config);
        return BSDF(ctx.wo, ctx.n, ctx.ns, ctx.dpdus, bxdf);
    }